

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_validate(nk_rune *u,int i)

{
  int local_1c;
  int i_local;
  nk_rune *u_local;
  
  if (u != (nk_rune *)0x0) {
    if (u == (nk_rune *)0x0) {
      u_local._4_4_ = 0;
    }
    else {
      if (((*u < nk_utfmin[i]) || (nk_utfmax[i] <= *u)) || ((0xd7ff < *u && (*u < 0xdfff)))) {
        *u = 0xfffd;
      }
      for (local_1c = 1; nk_utfmax[local_1c] < *u; local_1c = local_1c + 1) {
      }
      u_local._4_4_ = local_1c;
    }
    return u_local._4_4_;
  }
  __assert_fail("u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x1e67,"int nk_utf_validate(nk_rune *, int)");
}

Assistant:

NK_INTERN int
nk_utf_validate(nk_rune *u, int i)
{
    NK_ASSERT(u);
    if (!u) return 0;
    if (!NK_BETWEEN(*u, nk_utfmin[i], nk_utfmax[i]) ||
         NK_BETWEEN(*u, 0xD800, 0xDFFF))
            *u = NK_UTF_INVALID;
    for (i = 1; *u > nk_utfmax[i]; ++i);
    return i;
}